

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

char * __thiscall QListModel::index(QListModel *this,char *__s,int __c)

{
  long *plVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  long lVar5;
  ulong uVar6;
  
  lVar5 = CONCAT44(in_register_00000014,__c);
  if ((((lVar5 != 0) && (*(QAbstractItemView **)(lVar5 + 0x10) != (QAbstractItemView *)0x0)) &&
      (pQVar2 = QAbstractItemView::model(*(QAbstractItemView **)(lVar5 + 0x10)),
      pQVar2 == (QAbstractItemModel *)__s)) && (uVar6 = *(ulong *)(__s + 0x20), uVar6 != 0)) {
    iVar3 = *(int *)(*(long *)(lVar5 + 0x18) + 0x20);
    uVar4 = (ulong)iVar3;
    if ((((long)uVar4 < 0) || (uVar6 <= uVar4)) ||
       (*(long *)(*(long *)(__s + 0x18) + uVar4 * 8) != lVar5)) {
      uVar6 = uVar6 << 3;
      do {
        if (uVar6 == 0) {
          iVar3 = -1;
          goto LAB_00585ba6;
        }
        uVar4 = uVar6 - 8;
        plVar1 = (long *)(*(long *)(__s + 0x18) + -8 + uVar6);
        uVar6 = uVar4;
      } while (*plVar1 != lVar5);
      iVar3 = (int)(uVar4 >> 3);
LAB_00585ba6:
      if (iVar3 == -1) goto LAB_00585b44;
      *(int *)(*(long *)(lVar5 + 0x18) + 0x20) = iVar3;
    }
    *(int *)this = iVar3;
    *(undefined4 *)&this->field_0x4 = 0;
    *(long *)&this->field_0x8 = lVar5;
    (this->items).d.d = (Data *)__s;
    return (char *)this;
  }
LAB_00585b44:
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  (this->items).d.d = (Data *)0x0;
  return (char *)this;
}

Assistant:

QModelIndex QListModel::index(const QListWidgetItem *item_) const
{
    QListWidgetItem *item = const_cast<QListWidgetItem *>(item_);
    if (!item || !item->view || static_cast<const QListModel *>(item->view->model()) != this
        || items.isEmpty())
        return QModelIndex();
    int row;
    const int theid = item->d->theid;
    if (theid >= 0 && theid < items.size() && items.at(theid) == item) {
        row = theid;
    } else { // we need to search for the item
        row = items.lastIndexOf(item);  // lastIndexOf is an optimization in favor of indexOf
        if (row == -1) // not found
            return QModelIndex();
        item->d->theid = row;
    }
    return createIndex(row, 0, item);
}